

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  int local_88 [2];
  int nums2d_2 [10];
  int local_58 [2];
  int nums2d [2] [5];
  int i;
  int len;
  int nums [5];
  
  _i = 0x200000001;
  nums[0] = 3;
  nums[1] = 4;
  nums[2] = 5;
  nums2d[1][4] = 5;
  add_one_to_array(&i,5);
  for (nums2d[1][3] = 0; nums2d[1][3] < nums2d[1][4]; nums2d[1][3] = nums2d[1][3] + 1) {
    printf("%i ",(ulong)(uint)(&i)[nums2d[1][3]]);
  }
  printf("\n");
  memcpy(local_58,&DAT_00102030,0x28);
  memcpy(local_88,&DAT_00102060,0x28);
  print_two_dimensions((int (*) [5])local_58,2,5);
  print_one_dimension(local_88,10);
  return 0;
}

Assistant:

int main() {

    int nums[] = {1, 2, 3, 4, 5};
    int len = sizeof(nums)/sizeof(int);

    add_one_to_array(nums, len);

    for (int i=0; i<len; i++) {
        printf("%i ", nums[i]);
    }
    printf("\n");

    int nums2d[2][5] = {
        {1, 2, 3, 4, 5},
        {6, 7, 8, 9, 10}
    };
    int nums2d_2[10] = {
            1, 2, 3, 4, 5, 6, 7, 8, 9, 10
    };

    print_two_dimensions(nums2d, 2, 5);

    print_one_dimension(nums2d_2, sizeof(nums2d_2)/sizeof(int));

    return 0;
}